

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

PSprite __thiscall SpriteBase::create_mask(SpriteBase *this,PSprite *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  SpriteBase *pSVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined1 auVar8 [16];
  PSprite PVar9;
  undefined1 local_51;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  SpriteBase *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auVar8 = (**(code **)(*(long *)*in_RDX + 8))();
  _Var7._M_pi = auVar8._8_8_;
  if (p_Var1 == auVar8._0_8_) {
    peVar2 = other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar8 = (**(code **)(*(long *)*in_RDX + 0x10))();
    _Var7._M_pi = auVar8._8_8_;
    if (peVar2 == auVar8._0_8_) {
      std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Data::Sprite,void>
                (local_50,(__weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> *)
                          &(other->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount);
      local_40 = (SpriteBase *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SpriteBase,std::allocator<SpriteBase>,std::shared_ptr<Data::Sprite>>
                (&local_38,&local_40,(allocator<SpriteBase> *)&local_51,
                 (shared_ptr<Data::Sprite> *)local_50);
      std::__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<SpriteBase,SpriteBase>
                ((__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2> *)&local_40,local_40);
      _Var7._M_pi = local_38._M_pi;
      pSVar3 = local_40;
      (this->super_Sprite)._vptr_Sprite = (_func_int **)local_40;
      (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
      super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
      super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var7._M_pi;
      local_40 = (SpriteBase *)0x0;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      p_Var1 = other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      lVar5 = (*(code *)**(undefined8 **)*in_RDX)();
      iVar4 = (**(pSVar3->super_Sprite)._vptr_Sprite)(pSVar3);
      uVar6 = (long)other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
              (long)other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      _Var7._M_pi = extraout_RDX;
      if (uVar6 != 0) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          *(uint *)(CONCAT44(extraout_var,iVar4) + (long)_Var7._M_pi * 4) =
               -(uint)(*(int *)((long)&p_Var1->_vptr__Sp_counted_base + (long)_Var7._M_pi * 4) !=
                      *(int *)(lVar5 + (long)_Var7._M_pi * 4));
          _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 1);
        } while (((ulong)_Var7._M_pi & 0xffffffff) <= uVar6 &&
                 uVar6 - ((ulong)_Var7._M_pi & 0xffffffff) != 0);
      }
      goto LAB_0013bf39;
    }
  }
  (this->super_Sprite)._vptr_Sprite = (_func_int **)0x0;
  (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
  super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0013bf39:
  PVar9.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  PVar9.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Sprite;
  return (PSprite)PVar9.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
SpriteBase::create_mask(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return nullptr;
  }

  Data::PSprite result = std::make_shared<SpriteBase>(shared_from_this());

  uint32_t *src1 = reinterpret_cast<uint32_t*>(data);
  uint32_t *src2 = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(result->get_data());

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src1++ == *src2++) {
      *res++ = 0x00000000;
    } else {
      *res++ = 0xFFFFFFFF;
    }
  }

  return result;
}